

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O2

int IDASetJacTimesResFn(void *ida_mem,IDAResFn jtimesResFn)

{
  int iVar1;
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"IDASetJacTimesResFn",&IDA_mem,&idals_mem);
  if (iVar1 == 0) {
    if (idals_mem->jtimesDQ == 0) {
      iVar1 = -3;
      IDAProcessError(IDA_mem,-3,0x20f,"IDASetJacTimesResFn",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_ls.c"
                      ,"Internal finite-difference Jacobian-vector product is disabled.");
    }
    else {
      if (jtimesResFn == (IDAResFn)0x0) {
        idals_mem->jt_res = IDA_mem->ida_res;
      }
      else {
        idals_mem->jt_res = jtimesResFn;
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int IDASetJacTimesResFn(void* ida_mem, IDAResFn jtimesResFn)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* check if using internal finite difference approximation */
  if (!(idals_mem->jtimesDQ))
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Internal finite-difference Jacobian-vector product is disabled.");
    return (IDALS_ILL_INPUT);
  }

  /* store function pointers for Res function (NULL implies use DAE Res) */
  if (jtimesResFn != NULL) { idals_mem->jt_res = jtimesResFn; }
  else { idals_mem->jt_res = IDA_mem->ida_res; }

  return (IDALS_SUCCESS);
}